

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O1

void Msat_SolverClaBumpActivity(Msat_Solver_t *p,Msat_Clause_t *pC)

{
  float fVar1;
  
  fVar1 = Msat_ClauseReadActivity(pC);
  if (1e+20 < (double)fVar1 + p->dClaInc) {
    Msat_SolverClaRescaleActivity(p);
    fVar1 = Msat_ClauseReadActivity(pC);
  }
  Msat_ClauseWriteActivity(pC,(float)p->dClaInc + fVar1);
  return;
}

Assistant:

void Msat_SolverClaBumpActivity( Msat_Solver_t * p, Msat_Clause_t * pC )
{
    float Activ;
    Activ = Msat_ClauseReadActivity(pC);
    if ( Activ + p->dClaInc > 1e20 )
    {
        Msat_SolverClaRescaleActivity( p );
        Activ = Msat_ClauseReadActivity( pC );
    }
    Msat_ClauseWriteActivity( pC, Activ + (float)p->dClaInc );
}